

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int write_header(FIOBJ o,void *w_)

{
  FIOBJ FVar1;
  size_t sVar2;
  void *in_RCX;
  _func_int_FIOBJ_void_ptr *task;
  fiobj_type_enum type;
  fio_str_info_s str;
  fio_str_info_s name;
  void *pvVar3;
  
  if (o != 0) {
    pvVar3 = w_;
    FVar1 = fiobj_hash_key_in_loop();
    type = (fiobj_type_enum)pvVar3;
    if (FVar1 != 0) {
      FVar1 = fiobj_hash_key_in_loop();
      *(FIOBJ *)((long)w_ + 8) = FVar1;
    }
    sVar2 = fiobj_type_is(o,type);
    if (sVar2 == 0) {
      fiobj_obj2cstr(&name,*(FIOBJ *)((long)w_ + 8));
      fiobj_obj2cstr(&str,o);
      if (str.data != (char *)0x0) {
        fiobj_str_write(*w_,name.data,name.len);
        fiobj_str_write(*w_,":",1);
        fiobj_str_write(*w_,str.data,str.len);
        fiobj_str_write(*w_,"\r\n",2);
      }
    }
    else {
      fiobj_each1(o,(size_t)w_,task,in_RCX);
    }
  }
  return 0;
}

Assistant:

static int write_header(FIOBJ o, void *w_) {
  struct header_writer_s *w = w_;
  if (!o)
    return 0;
  if (fiobj_hash_key_in_loop()) {
    w->name = fiobj_hash_key_in_loop();
  }
  if (FIOBJ_TYPE_IS(o, FIOBJ_T_ARRAY)) {
    fiobj_each1(o, 0, write_header, w);
    return 0;
  }
  fio_str_info_s name = fiobj_obj2cstr(w->name);
  fio_str_info_s str = fiobj_obj2cstr(o);
  if (!str.data)
    return 0;
  fiobj_str_write(w->dest, name.data, name.len);
  fiobj_str_write(w->dest, ":", 1);
  fiobj_str_write(w->dest, str.data, str.len);
  fiobj_str_write(w->dest, "\r\n", 2);
  return 0;
}